

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

t_float fielddesc_cvttocoord(_fielddesc *f,t_float val)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = f->fd_v1;
  fVar2 = f->fd_v2;
  if ((fVar2 == fVar3) && (!NAN(fVar2) && !NAN(fVar3))) {
    return val;
  }
  fVar4 = f->fd_screen1;
  fVar1 = f->fd_screen2;
  fVar2 = (val - fVar3) * ((fVar1 - fVar4) / (fVar2 - fVar3)) + fVar4;
  fVar3 = fVar4;
  if (fVar1 <= fVar4) {
    fVar3 = fVar1;
  }
  if (fVar3 <= fVar2) {
    fVar3 = fVar2;
  }
  if (fVar4 <= fVar1) {
    fVar4 = fVar1;
  }
  if (fVar3 <= fVar4) {
    fVar4 = fVar3;
  }
  return fVar4;
}

Assistant:

t_float fielddesc_cvttocoord(t_fielddesc *f, t_float val)
{
    t_float coord, pix, extreme, div;
    if (f->fd_v2 == f->fd_v1)
        return (val);
    div = (f->fd_screen2 - f->fd_screen1)/(f->fd_v2 - f->fd_v1);
    coord = f->fd_screen1 + (val - f->fd_v1) * div;
    extreme = (f->fd_screen1 < f->fd_screen2 ?
        f->fd_screen1 : f->fd_screen2);
    if (coord < extreme)
        coord = extreme;
    extreme = (f->fd_screen1 > f->fd_screen2 ?
        f->fd_screen1 : f->fd_screen2);
    if (coord > extreme)
        coord = extreme;
    return (coord);
}